

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

void Wlc_WriteNdr(Wlc_Ntk_t *pNtk,char *pFileName)

{
  void *pDesign_00;
  void *pDesign;
  char *pFileName_local;
  Wlc_Ntk_t *pNtk_local;
  
  pDesign_00 = Wlc_NtkToNdr(pNtk);
  Ndr_Write(pFileName,pDesign_00);
  Ndr_Delete(pDesign_00);
  printf("Dumped the current design into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Wlc_WriteNdr( Wlc_Ntk_t * pNtk, char * pFileName )
{
    void * pDesign = Wlc_NtkToNdr( pNtk );
    Ndr_Write( pFileName, pDesign );
    Ndr_Delete( pDesign );
    printf( "Dumped the current design into file \"%s\".\n", pFileName );
}